

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

ctrl_t * phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<Key<3ul>const,unsigned_int>>,std::allocator<std::pair<Key<3ul>const,unsigned_int>>>>
                   (void)

{
  return EmptyGroup<std::is_same<std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>_>
         ::empty_group;
}

Assistant:

inline ctrl_t* EmptyGroup() {
  PHMAP_IF_CONSTEXPR (std_alloc_t::value) {
      alignas(16) static constexpr ctrl_t empty_group[] = {
          kSentinel, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty,
          kEmpty,    kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty};

      return const_cast<ctrl_t*>(empty_group);
  } else {
       return nullptr;
  }
}